

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::IndirectBufferTestInstance::initializeBuffers
          (IndirectBufferTestInstance *this)

{
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  VkDeviceSize vkd;
  DeviceInterface *vk_00;
  VkDevice pVVar1;
  Allocator *allocator;
  Handle<(vk::HandleType)8> *pHVar2;
  Allocation *pAVar3;
  void *pvVar4;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  undefined4 *puVar5;
  MovePtr *this_00;
  VkDrawIndirectCommand *pCmdData;
  deUint8 *pData;
  deUint32 chunkNdx;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_c8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_b8;
  VkBufferCreateInfo local_98;
  Move<vk::Handle<(vk::HandleType)8>_> local_60;
  RefData<vk::Handle<(vk::HandleType)8>_> local_40;
  undefined8 local_20;
  VkDeviceSize vertexBufferSize;
  DeviceInterface *vk;
  IndirectBufferTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  vk_00 = SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  local_20 = 0x60;
  vertexBufferSize = (VkDeviceSize)vk_00;
  pVVar1 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  makeBufferCreateInfo(&local_98,0x60,0x80);
  makeBuffer(&local_60,vk_00,pVVar1,&local_98);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  data_00.deleter.m_deviceIface = local_40.deleter.m_deviceIface;
  data_00.object.m_internal = local_40.object.m_internal;
  data_00.deleter.m_device = local_40.deleter.m_device;
  data_00.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_vertexBuffer,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_60);
  this_00 = (MovePtr *)vertexBufferSize;
  pVVar1 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  allocator = SparseResourcesBaseInstance::getAllocator((SparseResourcesBaseInstance *)this);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_c8,
             (DeviceInterface *)this_00,pVVar1,allocator,(VkBuffer)pHVar2->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_c8,this_00);
  data._8_8_ = local_40.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_40.object.m_internal;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_vertexBufferAlloc,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_c8);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvVar4 = ::vk::Allocation::getHostPtr(pAVar3);
  generateGrid(pvVar4,2.0,-1.0,-1.0,1,1,0.0);
  vkd = vertexBufferSize;
  pVVar1 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar3);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vkd,pVVar1,memory,offset,0x60);
  for (pData._4_4_ = 0; pData._4_4_ < 2; pData._4_4_ = pData._4_4_ + 1) {
    pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&(this->super_DrawGridTestInstance).m_stagingBufferAlloc.
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    pvVar4 = ::vk::Allocation::getHostPtr(pAVar3);
    puVar5 = (undefined4 *)
             ((long)pvVar4 +
             (ulong)pData._4_4_ * (this->super_DrawGridTestInstance).m_perDrawBufferOffset);
    puVar5[2] = pData._4_4_ * 3;
    puVar5[3] = 0;
    *puVar5 = 3;
    puVar5[1] = 1;
  }
  return;
}

Assistant:

void initializeBuffers (void)
	{
		// Vertex buffer
		const DeviceInterface&	vk					= getDeviceInterface();
		const VkDeviceSize		vertexBufferSize	= 2 * 3 * sizeof(Vec4);
								m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
								m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

		{
			generateGrid(m_vertexBufferAlloc->getHostPtr(), 2.0f, -1.0f, -1.0f, 1, 1);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Indirect buffer
		for (deUint32 chunkNdx = 0u; chunkNdx < 2; ++chunkNdx)
		{
			deUint8* const					pData		= static_cast<deUint8*>(m_stagingBufferAlloc->getHostPtr()) + chunkNdx * m_perDrawBufferOffset;
			VkDrawIndirectCommand* const	pCmdData	= reinterpret_cast<VkDrawIndirectCommand*>(pData);

			pCmdData->firstVertex	= 3u * chunkNdx;
			pCmdData->firstInstance	= 0u;
			pCmdData->vertexCount	= 3u;
			pCmdData->instanceCount	= 1u;
		}
	}